

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O2

DOMElement * __thiscall
xercesc_4_0::DOMElementImpl::getLastElementChild(DOMElementImpl *this,DOMNode *n)

{
  int iVar1;
  DOMNode *pDVar2;
  undefined4 extraout_var_00;
  DOMNode *pDVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  pDVar2 = n;
  do {
    pDVar3 = pDVar2;
    pDVar2 = (DOMNode *)0x0;
    if ((pDVar3 == (DOMNode *)0x0) ||
       (iVar1 = (*((DOMNode *)&pDVar3->_vptr_DOMNode)->_vptr_DOMNode[4])(pDVar3), pDVar2 = pDVar3,
       iVar1 == 1)) {
      return (DOMElement *)pDVar2;
    }
    iVar1 = (*((DOMNode *)&pDVar3->_vptr_DOMNode)->_vptr_DOMNode[8])(pDVar3);
    pDVar2 = (DOMNode *)CONCAT44(extraout_var,iVar1);
    while ((pDVar2 == (DOMNode *)0x0 && (pDVar3 != n))) {
      iVar1 = (*((DOMNode *)&pDVar3->_vptr_DOMNode)->_vptr_DOMNode[9])(pDVar3);
      pDVar2 = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      if (pDVar2 == (DOMNode *)0x0) {
        iVar1 = (*((DOMNode *)&pDVar3->_vptr_DOMNode)->_vptr_DOMNode[5])(pDVar3);
        pDVar3 = (DOMNode *)CONCAT44(extraout_var_01,iVar1);
        if (pDVar3 == (DOMNode *)0x0) {
          return (DOMElement *)0x0;
        }
        if (pDVar3 == n) {
          return (DOMElement *)0x0;
        }
      }
    }
  } while( true );
}

Assistant:

DOMElement* DOMElementImpl::getLastElementChild(const DOMNode* n) const
{
    const DOMNode* top = n;
    while (n != NULL) {
        if (n->getNodeType() == DOMNode::ELEMENT_NODE) {
            return (DOMElement*) n;
        }
        DOMNode* next = n->getLastChild();
        while (next == NULL) {
            if (top == n) {
                break;
            }
            next = n->getPreviousSibling();
            if (next == NULL) {
                n = n->getParentNode();
                if (n == NULL || top == n) {
                    return NULL;
                }
            }
        }
        n = next;
    }
    return NULL;
}